

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStems<unsigned_char>
               (char *label_id,uchar *xs,uchar *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_78 [8];
  GetterXsYRef<unsigned_char> get_base;
  GetterXsYs<unsigned_char> get_mark;
  int stride_local;
  int offset_local;
  double y_ref_local;
  int count_local;
  uchar *ys_local;
  uchar *xs_local;
  char *label_id_local;
  
  GetterXsYs<unsigned_char>::GetterXsYs
            ((GetterXsYs<unsigned_char> *)&get_base.Stride,xs,ys,count,offset,stride);
  GetterXsYRef<unsigned_char>::GetterXsYRef
            ((GetterXsYRef<unsigned_char> *)local_78,xs,y_ref,count,offset,stride);
  PlotStemsEx<ImPlot::GetterXsYs<unsigned_char>,ImPlot::GetterXsYRef<unsigned_char>>
            (label_id,(GetterXsYs<unsigned_char> *)&get_base.Stride,
             (GetterXsYRef<unsigned_char> *)local_78);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> get_mark(xs,ys,count,offset,stride);
    GetterXsYRef<T> get_base(xs,y_ref,count,offset,stride);
    PlotStemsEx(label_id, get_mark, get_base);
}